

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

void henson_save_double(char *name,double x)

{
  NameMap *this;
  Value v;
  allocator local_a9;
  string local_a8;
  data_t local_88;
  undefined4 local_50;
  Value local_48;
  
  this = namemap;
  if (namemap != (NameMap *)0x0) {
    local_50 = 4;
    local_88.tail_._0_8_ = (undefined8)x;
    std::__cxx11::string::string((string *)&local_a8,name,&local_a9);
    mpark::detail::
    copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::copy_constructor((copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                        *)&local_48,
                       (copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                        *)&local_88.head_);
    henson::NameMap::add(this,&local_a8,&local_48);
    mpark::detail::
    destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::~destructor((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                   *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    mpark::detail::
    destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::~destructor((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                   *)&local_88.head_);
  }
  return;
}

Assistant:

void
henson_save_double(const char* name, double  x)
{
    if (!namemap) return;
    henson::Value v = x;
    namemap->add(name, v);
}